

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O2

void __thiscall gnilk::LogBaseSink::~LogBaseSink(LogBaseSink *this)

{
  ~LogBaseSink(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

virtual ~LogBaseSink() = default;